

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

LY_ERR lyd_path_leaflist_predicate
                 (lyd_node *node,char **buffer,size_t *buflen,size_t *bufused,ly_bool is_static)

{
  LY_ERR LVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  
  __s = lyd_get_value(node);
  sVar3 = strlen(__s);
  LVar1 = lyd_path_str_enlarge(buffer,buflen,sVar3 + *bufused + 6,is_static);
  if (LVar1 == LY_SUCCESS) {
    pcVar4 = strchr(__s,0x27);
    uVar5 = (uint)(pcVar4 == (char *)0x0) * 5 + 0x22;
    iVar2 = sprintf(*buffer + *bufused,"[.=%c%s%c]",(ulong)uVar5,__s,(ulong)uVar5);
    *bufused = *bufused + (long)iVar2;
  }
  return LVar1;
}

Assistant:

static LY_ERR
lyd_path_leaflist_predicate(const struct lyd_node *node, char **buffer, size_t *buflen, size_t *bufused, ly_bool is_static)
{
    size_t len;
    const char *val;
    char quot;

    val = lyd_get_value(node);
    len = 4 + strlen(val) + 2; /* "[.='" + val + "']" */
    LY_CHECK_RET(lyd_path_str_enlarge(buffer, buflen, *bufused + len, is_static));

    quot = '\'';
    if (strchr(val, '\'')) {
        quot = '"';
    }
    *bufused += sprintf(*buffer + *bufused, "[.=%c%s%c]", quot, val, quot);

    return LY_SUCCESS;
}